

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,ImDrawFlags flags,
          float thickness)

{
  undefined8 uVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  undefined8 *puVar5;
  float *pfVar6;
  float *pfVar7;
  short sVar8;
  uint in_ECX;
  ImVec2 *pIVar9;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  float in_XMM0_Da;
  float fVar10;
  float fVar11;
  float fVar12;
  ImVec2 IVar13;
  float inv_len_1;
  float d2_3;
  float dy_1;
  float dx_1;
  ImVec2 *p2;
  ImVec2 *p1;
  int i2_3;
  int i1_3;
  int vtx_count_1;
  int idx_count_1;
  int i_2;
  ImVec2 *out_vtx_1;
  float dm_in_y;
  float dm_in_x;
  float dm_out_y;
  float dm_out_x;
  float inv_len2_1;
  float d2_2;
  float dm_y_1;
  float dm_x_1;
  uint idx2_1;
  int i2_2;
  int i1_2;
  uint idx1_1;
  int points_last;
  float half_inner_thickness;
  int i_1;
  int i;
  ImVec2 tex_uv1;
  ImVec2 tex_uv0;
  ImVec4 tex_uvs;
  ImVec2 *out_vtx;
  float inv_len2;
  float d2_1;
  float dm_y;
  float dm_x;
  uint idx2;
  int i2_1;
  int i1_1;
  uint idx1;
  float half_draw_size;
  float inv_len;
  float d2;
  float dy;
  float dx;
  int i2;
  int i1;
  ImVec2 *temp_points;
  ImVec2 *temp_normals;
  int vtx_count;
  int idx_count;
  bool use_texture;
  float fractional_thickness;
  int integer_thickness;
  ImU32 col_trans;
  float AA_SIZE;
  bool thick_line;
  int count;
  ImVec2 opaque_uv;
  bool closed;
  undefined4 in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  undefined8 in_stack_fffffffffffffd58;
  ImDrawList *in_stack_fffffffffffffd60;
  int local_268;
  int local_264;
  float local_240;
  int local_23c;
  uint local_228;
  uint local_224;
  int local_220;
  int local_21c;
  bool local_215;
  int local_214;
  float local_200;
  float local_1fc;
  int local_1e0;
  int local_1d4;
  float local_1b8;
  float local_1b0;
  float local_1ac;
  int local_1a0;
  int local_19c;
  int local_110;
  int local_10c;
  ImVec2 local_108;
  ImVec2 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  ImVec2 *local_e8;
  float local_dc;
  float local_d8;
  float local_d4;
  float local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  ImVec2 local_bc;
  ImVec2 local_b4;
  ImVec2 local_ac;
  ImVec2 local_a4;
  ImVec2 local_9c;
  ImVec2 local_94;
  ImVec2 local_8c;
  ImVec2 local_84;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  int local_68;
  int local_64;
  ImVec2 *local_60;
  long local_58;
  uint local_50;
  int local_4c;
  bool local_45;
  float local_44;
  int local_40;
  uint local_3c;
  float local_38;
  byte local_31;
  int local_30;
  undefined8 local_2c;
  byte local_21;
  float local_20;
  uint local_18;
  int local_14;
  long local_10;
  
  if (1 < in_EDX) {
    local_21 = (in_R8D & 1) != 0;
    local_2c = **(undefined8 **)(in_RDI + 0x38);
    local_214 = in_EDX;
    if (!(bool)local_21) {
      local_214 = in_EDX + -1;
    }
    local_30 = local_214;
    local_31 = *(float *)(in_RDI + 0xc0) <= in_XMM0_Da && in_XMM0_Da != *(float *)(in_RDI + 0xc0);
    local_18 = in_ECX;
    local_14 = in_EDX;
    local_10 = in_RSI;
    if ((*(uint *)(in_RDI + 0x30) & 1) == 0) {
      local_20 = in_XMM0_Da;
      PrimReserve(in_stack_fffffffffffffd60,(int)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                  (int)in_stack_fffffffffffffd58);
      for (local_1e0 = 0; local_1e0 < local_30; local_1e0 = local_1e0 + 1) {
        if (local_1e0 + 1 == local_14) {
          iVar3 = 0;
        }
        else {
          iVar3 = local_1e0 + 1;
        }
        pfVar6 = (float *)(local_10 + (long)local_1e0 * 8);
        pfVar7 = (float *)(local_10 + (long)iVar3 * 8);
        local_1fc = *pfVar7 - *pfVar6;
        local_200 = pfVar7[1] - pfVar6[1];
        if (0.0 < local_1fc * local_1fc + local_200 * local_200) {
          fVar10 = ImRsqrt(0.0);
          local_1fc = fVar10 * local_1fc;
          local_200 = fVar10 * local_200;
        }
        local_1fc = local_20 * 0.5 * local_1fc;
        local_200 = local_20 * 0.5 * local_200;
        **(float **)(in_RDI + 0x48) = *pfVar6 + local_200;
        *(float *)(*(long *)(in_RDI + 0x48) + 4) = pfVar6[1] - local_1fc;
        *(undefined8 *)(*(long *)(in_RDI + 0x48) + 8) = local_2c;
        *(uint *)(*(long *)(in_RDI + 0x48) + 0x10) = local_18;
        *(float *)(*(long *)(in_RDI + 0x48) + 0x14) = *pfVar7 + local_200;
        *(float *)(*(long *)(in_RDI + 0x48) + 0x18) = pfVar7[1] - local_1fc;
        *(undefined8 *)(*(long *)(in_RDI + 0x48) + 0x1c) = local_2c;
        *(uint *)(*(long *)(in_RDI + 0x48) + 0x24) = local_18;
        *(float *)(*(long *)(in_RDI + 0x48) + 0x28) = *pfVar7 - local_200;
        *(float *)(*(long *)(in_RDI + 0x48) + 0x2c) = pfVar7[1] + local_1fc;
        *(undefined8 *)(*(long *)(in_RDI + 0x48) + 0x30) = local_2c;
        *(uint *)(*(long *)(in_RDI + 0x48) + 0x38) = local_18;
        *(float *)(*(long *)(in_RDI + 0x48) + 0x3c) = *pfVar6 - local_200;
        *(float *)(*(long *)(in_RDI + 0x48) + 0x40) = pfVar6[1] + local_1fc;
        *(undefined8 *)(*(long *)(in_RDI + 0x48) + 0x44) = local_2c;
        *(uint *)(*(long *)(in_RDI + 0x48) + 0x4c) = local_18;
        *(long *)(in_RDI + 0x48) = *(long *)(in_RDI + 0x48) + 0x50;
        **(undefined2 **)(in_RDI + 0x50) = (short)*(undefined4 *)(in_RDI + 0x34);
        *(short *)(*(long *)(in_RDI + 0x50) + 2) = (short)*(undefined4 *)(in_RDI + 0x34) + 1;
        *(short *)(*(long *)(in_RDI + 0x50) + 4) = (short)*(undefined4 *)(in_RDI + 0x34) + 2;
        *(short *)(*(long *)(in_RDI + 0x50) + 6) = (short)*(undefined4 *)(in_RDI + 0x34);
        *(short *)(*(long *)(in_RDI + 0x50) + 8) = (short)*(undefined4 *)(in_RDI + 0x34) + 2;
        *(short *)(*(long *)(in_RDI + 0x50) + 10) = (short)*(undefined4 *)(in_RDI + 0x34) + 3;
        *(long *)(in_RDI + 0x50) = *(long *)(in_RDI + 0x50) + 0xc;
        *(int *)(in_RDI + 0x34) = *(int *)(in_RDI + 0x34) + 4;
      }
    }
    else {
      local_38 = *(float *)(in_RDI + 0xc0);
      local_3c = in_ECX & 0xffffff;
      local_20 = ImMax<float>(in_XMM0_Da,1.0);
      local_40 = (int)local_20;
      local_44 = local_20 - (float)local_40;
      local_215 = false;
      if ((((*(uint *)(in_RDI + 0x30) & 2) != 0) && (local_215 = false, local_40 < 0x3f)) &&
         (local_215 = false, local_44 <= 1e-05)) {
        local_215 = local_38 == 1.0;
      }
      local_45 = local_215;
      if (local_215 == false) {
        if ((local_31 & 1) == 0) {
          local_220 = local_30 * 0xc;
        }
        else {
          local_220 = local_30 * 0x12;
        }
        local_21c = local_220;
      }
      else {
        local_21c = local_30 * 6;
      }
      local_4c = local_21c;
      if (local_215 == false) {
        if ((local_31 & 1) == 0) {
          local_228 = local_14 * 3;
        }
        else {
          local_228 = local_14 << 2;
        }
        local_224 = local_228;
      }
      else {
        local_224 = local_14 << 1;
      }
      local_50 = local_224;
      PrimReserve(in_stack_fffffffffffffd60,(int)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                  (int)in_stack_fffffffffffffd58);
      ImVector<ImVec2>::reserve_discard
                ((ImVector<ImVec2> *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                 in_stack_fffffffffffffd4c);
      local_58 = *(long *)(*(long *)(in_RDI + 0x38) + 0x38);
      local_60 = (ImVec2 *)(local_58 + (long)local_14 * 8);
      for (local_64 = 0; local_64 < local_30; local_64 = local_64 + 1) {
        if (local_64 + 1 == local_14) {
          local_23c = 0;
        }
        else {
          local_23c = local_64 + 1;
        }
        local_68 = local_23c;
        local_6c = *(float *)(local_10 + (long)local_23c * 8) -
                   *(float *)(local_10 + (long)local_64 * 8);
        local_70 = *(float *)(local_10 + 4 + (long)local_23c * 8) -
                   *(float *)(local_10 + 4 + (long)local_64 * 8);
        local_74 = local_6c * local_6c + local_70 * local_70;
        if (0.0 < local_74) {
          local_78 = ImRsqrt(0.0);
          local_6c = local_78 * local_6c;
          local_70 = local_78 * local_70;
        }
        *(float *)(local_58 + (long)local_64 * 8) = local_70;
        *(float *)(local_58 + 4 + (long)local_64 * 8) = -local_6c;
      }
      if ((local_21 & 1) == 0) {
        *(undefined8 *)(local_58 + (long)(local_14 + -1) * 8) =
             *(undefined8 *)(local_58 + (long)(local_14 + -2) * 8);
      }
      if (((local_45 & 1U) == 0) && ((local_31 & 1) != 0)) {
        fVar10 = (local_20 - local_38) * 0.5;
        if ((local_21 & 1) == 0) {
          iVar3 = local_14 + -1;
          ::operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),0.0);
          IVar13 = ::operator+((ImVec2 *)
                               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                               (ImVec2 *)0x4ce006);
          *local_60 = IVar13;
          ::operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),0.0);
          IVar13 = ::operator+((ImVec2 *)
                               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                               (ImVec2 *)0x4ce060);
          local_60[1] = IVar13;
          ::operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),0.0);
          IVar13 = ::operator-((ImVec2 *)
                               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                               (ImVec2 *)0x4ce0bb);
          local_60[2] = IVar13;
          ::operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),0.0);
          IVar13 = ::operator-((ImVec2 *)
                               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                               (ImVec2 *)0x4ce123);
          local_60[3] = IVar13;
          ::operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),0.0);
          IVar13 = ::operator+((ImVec2 *)
                               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                               (ImVec2 *)0x4ce19b);
          local_60[iVar3 * 4] = IVar13;
          ::operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),0.0);
          IVar13 = ::operator+((ImVec2 *)
                               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                               (ImVec2 *)0x4ce213);
          local_60[(long)(iVar3 * 4) + 1] = IVar13;
          ::operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),0.0);
          IVar13 = ::operator-((ImVec2 *)
                               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                               (ImVec2 *)0x4ce28c);
          local_60[(long)(iVar3 * 4) + 2] = IVar13;
          ::operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),0.0);
          IVar13 = ::operator-((ImVec2 *)
                               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                               (ImVec2 *)0x4ce312);
          local_60[iVar3 * 4 + 3] = IVar13;
        }
        local_19c = *(int *)(in_RDI + 0x34);
        for (local_1a0 = 0; local_1a0 < local_30; local_1a0 = local_1a0 + 1) {
          if (local_1a0 + 1 == local_14) {
            iVar3 = 0;
          }
          else {
            iVar3 = local_1a0 + 1;
          }
          if (local_1a0 + 1 == local_14) {
            iVar4 = *(int *)(in_RDI + 0x34);
          }
          else {
            iVar4 = local_19c + 4;
          }
          local_1ac = (*(float *)(local_58 + (long)local_1a0 * 8) +
                      *(float *)(local_58 + (long)iVar3 * 8)) * 0.5;
          local_1b0 = (*(float *)(local_58 + 4 + (long)local_1a0 * 8) +
                      *(float *)(local_58 + 4 + (long)iVar3 * 8)) * 0.5;
          local_1b8 = local_1ac * local_1ac + local_1b0 * local_1b0;
          if (1e-06 < local_1b8) {
            local_1b8 = 1.0 / local_1b8;
            if (100.0 < local_1b8) {
              local_1b8 = 100.0;
            }
            local_1ac = local_1b8 * local_1ac;
            local_1b0 = local_1b8 * local_1b0;
          }
          fVar11 = local_1ac * (fVar10 + local_38);
          fVar12 = local_1b0 * (fVar10 + local_38);
          pIVar9 = local_60 + (iVar3 << 2);
          pIVar9->x = *(float *)(local_10 + (long)iVar3 * 8) + fVar11;
          pIVar9->y = *(float *)(local_10 + 4 + (long)iVar3 * 8) + fVar12;
          pIVar9[1].x = *(float *)(local_10 + (long)iVar3 * 8) + local_1ac * fVar10;
          pIVar9[1].y = *(float *)(local_10 + 4 + (long)iVar3 * 8) + local_1b0 * fVar10;
          pIVar9[2].x = *(float *)(local_10 + (long)iVar3 * 8) - local_1ac * fVar10;
          pIVar9[2].y = *(float *)(local_10 + 4 + (long)iVar3 * 8) - local_1b0 * fVar10;
          pIVar9[3].x = *(float *)(local_10 + (long)iVar3 * 8) - fVar11;
          pIVar9[3].y = *(float *)(local_10 + 4 + (long)iVar3 * 8) - fVar12;
          sVar2 = (short)iVar4;
          **(short **)(in_RDI + 0x50) = sVar2 + 1;
          sVar8 = (short)local_19c;
          *(short *)(*(long *)(in_RDI + 0x50) + 2) = sVar8 + 1;
          *(short *)(*(long *)(in_RDI + 0x50) + 4) = sVar8 + 2;
          *(short *)(*(long *)(in_RDI + 0x50) + 6) = sVar8 + 2;
          *(short *)(*(long *)(in_RDI + 0x50) + 8) = sVar2 + 2;
          *(short *)(*(long *)(in_RDI + 0x50) + 10) = sVar2 + 1;
          *(short *)(*(long *)(in_RDI + 0x50) + 0xc) = sVar2 + 1;
          *(short *)(*(long *)(in_RDI + 0x50) + 0xe) = sVar8 + 1;
          *(short *)(*(long *)(in_RDI + 0x50) + 0x10) = sVar8;
          *(short *)(*(long *)(in_RDI + 0x50) + 0x12) = sVar8;
          *(short *)(*(long *)(in_RDI + 0x50) + 0x14) = sVar2;
          *(short *)(*(long *)(in_RDI + 0x50) + 0x16) = sVar2 + 1;
          *(short *)(*(long *)(in_RDI + 0x50) + 0x18) = sVar2 + 2;
          *(short *)(*(long *)(in_RDI + 0x50) + 0x1a) = sVar8 + 2;
          *(short *)(*(long *)(in_RDI + 0x50) + 0x1c) = sVar8 + 3;
          *(short *)(*(long *)(in_RDI + 0x50) + 0x1e) = sVar8 + 3;
          *(short *)(*(long *)(in_RDI + 0x50) + 0x20) = sVar2 + 3;
          *(short *)(*(long *)(in_RDI + 0x50) + 0x22) = sVar2 + 2;
          *(long *)(in_RDI + 0x50) = *(long *)(in_RDI + 0x50) + 0x24;
          local_19c = iVar4;
        }
        for (local_1d4 = 0; local_1d4 < local_14; local_1d4 = local_1d4 + 1) {
          **(ImVec2 **)(in_RDI + 0x48) = local_60[local_1d4 << 2];
          *(undefined8 *)(*(long *)(in_RDI + 0x48) + 8) = local_2c;
          *(uint *)(*(long *)(in_RDI + 0x48) + 0x10) = local_3c;
          *(ImVec2 *)(*(long *)(in_RDI + 0x48) + 0x14) = local_60[local_1d4 * 4 + 1];
          *(undefined8 *)(*(long *)(in_RDI + 0x48) + 0x1c) = local_2c;
          *(uint *)(*(long *)(in_RDI + 0x48) + 0x24) = local_18;
          *(ImVec2 *)(*(long *)(in_RDI + 0x48) + 0x28) = local_60[local_1d4 * 4 + 2];
          *(undefined8 *)(*(long *)(in_RDI + 0x48) + 0x30) = local_2c;
          *(uint *)(*(long *)(in_RDI + 0x48) + 0x38) = local_18;
          *(ImVec2 *)(*(long *)(in_RDI + 0x48) + 0x3c) = local_60[local_1d4 * 4 + 3];
          *(undefined8 *)(*(long *)(in_RDI + 0x48) + 0x44) = local_2c;
          *(uint *)(*(long *)(in_RDI + 0x48) + 0x4c) = local_3c;
          *(long *)(in_RDI + 0x48) = *(long *)(in_RDI + 0x48) + 0x50;
        }
      }
      else {
        if ((local_45 & 1U) == 0) {
          local_240 = local_38;
        }
        else {
          local_240 = local_20 * 0.5 + 1.0;
        }
        local_7c = local_240;
        if ((local_21 & 1) == 0) {
          local_8c = ::operator*((ImVec2 *)
                                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),0.0);
          local_84 = ::operator+((ImVec2 *)
                                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                                 (ImVec2 *)0x4cd6c7);
          *local_60 = local_84;
          local_9c = ::operator*((ImVec2 *)
                                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),0.0);
          local_94 = ::operator-((ImVec2 *)
                                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                                 (ImVec2 *)0x4cd721);
          local_60[1] = local_94;
          local_ac = ::operator*((ImVec2 *)
                                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),0.0);
          local_a4 = ::operator+((ImVec2 *)
                                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                                 (ImVec2 *)0x4cd790);
          local_60[local_14 * 2 + -2] = local_a4;
          local_bc = ::operator*((ImVec2 *)
                                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),0.0);
          local_b4 = ::operator-((ImVec2 *)
                                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                                 (ImVec2 *)0x4cd80f);
          local_60[(local_14 + -1) * 2 + 1] = local_b4;
        }
        local_c0 = *(int *)(in_RDI + 0x34);
        for (local_c4 = 0; local_c4 < local_30; local_c4 = local_c4 + 1) {
          if (local_c4 + 1 == local_14) {
            local_264 = 0;
          }
          else {
            local_264 = local_c4 + 1;
          }
          local_c8 = local_264;
          if (local_c4 + 1 == local_14) {
            local_268 = *(int *)(in_RDI + 0x34);
          }
          else {
            local_268 = 3;
            if ((local_45 & 1U) != 0) {
              local_268 = 2;
            }
            local_268 = local_c0 + local_268;
          }
          local_cc = local_268;
          local_d0 = (*(float *)(local_58 + (long)local_c4 * 8) +
                     *(float *)(local_58 + (long)local_264 * 8)) * 0.5;
          local_d4 = (*(float *)(local_58 + 4 + (long)local_c4 * 8) +
                     *(float *)(local_58 + 4 + (long)local_264 * 8)) * 0.5;
          local_d8 = local_d0 * local_d0 + local_d4 * local_d4;
          if (1e-06 < local_d8) {
            local_dc = 1.0 / local_d8;
            if (100.0 < local_dc) {
              local_dc = 100.0;
            }
            local_d0 = local_dc * local_d0;
            local_d4 = local_dc * local_d4;
          }
          local_d0 = local_7c * local_d0;
          local_d4 = local_7c * local_d4;
          local_e8 = local_60 + (local_264 << 1);
          local_e8->x = *(float *)(local_10 + (long)local_264 * 8) + local_d0;
          local_e8->y = *(float *)(local_10 + 4 + (long)local_264 * 8) + local_d4;
          local_e8[1].x = *(float *)(local_10 + (long)local_264 * 8) - local_d0;
          local_e8[1].y = *(float *)(local_10 + 4 + (long)local_264 * 8) - local_d4;
          sVar8 = (short)local_268;
          sVar2 = (short)local_c0;
          if ((local_45 & 1U) == 0) {
            **(short **)(in_RDI + 0x50) = sVar8;
            *(short *)(*(long *)(in_RDI + 0x50) + 2) = sVar2;
            *(short *)(*(long *)(in_RDI + 0x50) + 4) = sVar2 + 2;
            *(short *)(*(long *)(in_RDI + 0x50) + 6) = sVar2 + 2;
            *(short *)(*(long *)(in_RDI + 0x50) + 8) = sVar8 + 2;
            *(short *)(*(long *)(in_RDI + 0x50) + 10) = sVar8;
            *(short *)(*(long *)(in_RDI + 0x50) + 0xc) = sVar8 + 1;
            *(short *)(*(long *)(in_RDI + 0x50) + 0xe) = sVar2 + 1;
            *(short *)(*(long *)(in_RDI + 0x50) + 0x10) = sVar2;
            *(short *)(*(long *)(in_RDI + 0x50) + 0x12) = sVar2;
            *(short *)(*(long *)(in_RDI + 0x50) + 0x14) = sVar8;
            *(short *)(*(long *)(in_RDI + 0x50) + 0x16) = sVar8 + 1;
            *(long *)(in_RDI + 0x50) = *(long *)(in_RDI + 0x50) + 0x18;
          }
          else {
            **(short **)(in_RDI + 0x50) = sVar8;
            *(short *)(*(long *)(in_RDI + 0x50) + 2) = sVar2;
            *(short *)(*(long *)(in_RDI + 0x50) + 4) = sVar2 + 1;
            *(short *)(*(long *)(in_RDI + 0x50) + 6) = sVar8 + 1;
            *(short *)(*(long *)(in_RDI + 0x50) + 8) = sVar2 + 1;
            *(short *)(*(long *)(in_RDI + 0x50) + 10) = sVar8;
            *(long *)(in_RDI + 0x50) = *(long *)(in_RDI + 0x50) + 0xc;
          }
          local_c0 = local_268;
        }
        if ((local_45 & 1U) == 0) {
          for (local_110 = 0; local_110 < local_14; local_110 = local_110 + 1) {
            **(undefined8 **)(in_RDI + 0x48) = *(undefined8 *)(local_10 + (long)local_110 * 8);
            *(undefined8 *)(*(long *)(in_RDI + 0x48) + 8) = local_2c;
            *(uint *)(*(long *)(in_RDI + 0x48) + 0x10) = local_18;
            *(ImVec2 *)(*(long *)(in_RDI + 0x48) + 0x14) = local_60[local_110 << 1];
            *(undefined8 *)(*(long *)(in_RDI + 0x48) + 0x1c) = local_2c;
            *(uint *)(*(long *)(in_RDI + 0x48) + 0x24) = local_3c;
            *(ImVec2 *)(*(long *)(in_RDI + 0x48) + 0x28) = local_60[local_110 * 2 + 1];
            *(undefined8 *)(*(long *)(in_RDI + 0x48) + 0x30) = local_2c;
            *(uint *)(*(long *)(in_RDI + 0x48) + 0x38) = local_3c;
            *(long *)(in_RDI + 0x48) = *(long *)(in_RDI + 0x48) + 0x3c;
          }
        }
        else {
          puVar5 = (undefined8 *)
                   (*(long *)(*(long *)(in_RDI + 0x38) + 0x208) + (long)local_40 * 0x10);
          uVar1 = *puVar5;
          local_f0 = puVar5[1];
          local_f8._0_4_ = (float)uVar1;
          local_f8._4_4_ = (float)((ulong)uVar1 >> 0x20);
          fVar10 = local_f8._4_4_;
          fVar11 = (float)local_f8;
          local_f8 = uVar1;
          ImVec2::ImVec2(&local_100,fVar11,fVar10);
          ImVec2::ImVec2(&local_108,(float)local_f0,local_f0._4_4_);
          for (local_10c = 0; local_10c < local_14; local_10c = local_10c + 1) {
            **(ImVec2 **)(in_RDI + 0x48) = local_60[local_10c << 1];
            *(ImVec2 *)(*(long *)(in_RDI + 0x48) + 8) = local_100;
            *(uint *)(*(long *)(in_RDI + 0x48) + 0x10) = local_18;
            *(ImVec2 *)(*(long *)(in_RDI + 0x48) + 0x14) = local_60[local_10c * 2 + 1];
            *(ImVec2 *)(*(long *)(in_RDI + 0x48) + 0x1c) = local_108;
            *(uint *)(*(long *)(in_RDI + 0x48) + 0x24) = local_18;
            *(long *)(in_RDI + 0x48) = *(long *)(in_RDI + 0x48) + 0x28;
          }
        }
      }
      *(uint *)(in_RDI + 0x34) = (local_50 & 0xffff) + *(int *)(in_RDI + 0x34);
    }
  }
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, ImDrawFlags flags, float thickness)
{
    if (points_count < 2)
        return;

    const bool closed = (flags & ImDrawFlags_Closed) != 0;
    const ImVec2 opaque_uv = _Data->TexUvWhitePixel;
    const int count = closed ? points_count : points_count - 1; // The number of line segments we need to draw
    const bool thick_line = (thickness > _FringeScale);

    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        // Thicknesses <1.0 should behave like thickness 1.0
        thickness = ImMax(thickness, 1.0f);
        const int integer_thickness = (int)thickness;
        const float fractional_thickness = thickness - integer_thickness;

        // Do we want to draw this line using a texture?
        // - For now, only draw integer-width lines using textures to avoid issues with the way scaling occurs, could be improved.
        // - If AA_SIZE is not 1.0f we cannot use the texture path.
        const bool use_texture = (Flags & ImDrawListFlags_AntiAliasedLinesUseTex) && (integer_thickness < IM_DRAWLIST_TEX_LINES_WIDTH_MAX) && (fractional_thickness <= 0.00001f) && (AA_SIZE == 1.0f);

        // We should never hit this, because NewFrame() doesn't set ImDrawListFlags_AntiAliasedLinesUseTex unless ImFontAtlasFlags_NoBakedLines is off
        IM_ASSERT_PARANOID(!use_texture || !(_Data->Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines));

        const int idx_count = use_texture ? (count * 6) : (thick_line ? count * 18 : count * 12);
        const int vtx_count = use_texture ? (points_count * 2) : (thick_line ? points_count * 4 : points_count * 3);
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        // The first <points_count> items are normals at each line point, then after that there are either 2 or 4 temp points for each line point
        _Data->TempBuffer.reserve_discard(points_count * ((use_texture || !thick_line) ? 3 : 5));
        ImVec2* temp_normals = _Data->TempBuffer.Data;
        ImVec2* temp_points = temp_normals + points_count;

        // Calculate normals (tangents) for each line segment
        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count - 1] = temp_normals[points_count - 2];

        // If we are drawing a one-pixel-wide line without a texture, or a textured line of any width, we only need 2 or 3 vertices per point
        if (use_texture || !thick_line)
        {
            // [PATH 1] Texture-based lines (thick or non-thick)
            // [PATH 2] Non texture-based lines (non-thick)

            // The width of the geometry we need to draw - this is essentially <thickness> pixels for the line itself, plus "one pixel" for AA.
            // - In the texture-based path, we don't use AA_SIZE here because the +1 is tied to the generated texture
            //   (see ImFontAtlasBuildRenderLinesTexData() function), and so alternate values won't work without changes to that code.
            // - In the non texture-based paths, we would allow AA_SIZE to potentially be != 1.0f with a patch (e.g. fringe_scale patch to
            //   allow scaling geometry while preserving one-screen-pixel AA fringe).
            const float half_draw_size = use_texture ? ((thickness * 0.5f) + 1) : AA_SIZE;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * half_draw_size;
                temp_points[1] = points[0] - temp_normals[0] * half_draw_size;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * half_draw_size;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * half_draw_size;
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1; // i2 is the second point of the line segment
                const unsigned int idx2 = ((i1 + 1) == points_count) ? _VtxCurrentIdx : (idx1 + (use_texture ? 2 : 3)); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                dm_x *= half_draw_size; // dm_x, dm_y are offset to the outer edge of the AA area
                dm_y *= half_draw_size;

                // Add temporary vertexes for the outer edges
                ImVec2* out_vtx = &temp_points[i2 * 2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                if (use_texture)
                {
                    // Add indices for two triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 1); // Right tri
                    _IdxWritePtr[3] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[4] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Left tri
                    _IdxWritePtr += 6;
                }
                else
                {
                    // Add indexes for four triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 2); // Right tri 1
                    _IdxWritePtr[3] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Right tri 2
                    _IdxWritePtr[6] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8] = (ImDrawIdx)(idx1 + 0); // Left tri 1
                    _IdxWritePtr[9] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1); // Left tri 2
                    _IdxWritePtr += 12;
                }

                idx1 = idx2;
            }

            // Add vertexes for each point on the line
            if (use_texture)
            {
                // If we're using textures we only need to emit the left/right edge vertices
                ImVec4 tex_uvs = _Data->TexUvLines[integer_thickness];
                /*if (fractional_thickness != 0.0f) // Currently always zero when use_texture==false!
                {
                    const ImVec4 tex_uvs_1 = _Data->TexUvLines[integer_thickness + 1];
                    tex_uvs.x = tex_uvs.x + (tex_uvs_1.x - tex_uvs.x) * fractional_thickness; // inlined ImLerp()
                    tex_uvs.y = tex_uvs.y + (tex_uvs_1.y - tex_uvs.y) * fractional_thickness;
                    tex_uvs.z = tex_uvs.z + (tex_uvs_1.z - tex_uvs.z) * fractional_thickness;
                    tex_uvs.w = tex_uvs.w + (tex_uvs_1.w - tex_uvs.w) * fractional_thickness;
                }*/
                ImVec2 tex_uv0(tex_uvs.x, tex_uvs.y);
                ImVec2 tex_uv1(tex_uvs.z, tex_uvs.w);
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = temp_points[i * 2 + 0]; _VtxWritePtr[0].uv = tex_uv0; _VtxWritePtr[0].col = col; // Left-side outer edge
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 1]; _VtxWritePtr[1].uv = tex_uv1; _VtxWritePtr[1].col = col; // Right-side outer edge
                    _VtxWritePtr += 2;
                }
            }
            else
            {
                // If we're not using a texture, we need the center vertex as well
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = points[i];              _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;       // Center of line
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 0]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col_trans; // Left-side outer edge
                    _VtxWritePtr[2].pos = temp_points[i * 2 + 1]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col_trans; // Right-side outer edge
                    _VtxWritePtr += 3;
                }
            }
        }
        else
        {
            // [PATH 2] Non texture-based lines (thick): we need to draw the solid line core and thus require four vertices per point
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                const int points_last = points_count - 1;
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 0] = points[points_last] + temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 1] = points[points_last] + temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 2] = points[points_last] - temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 3] = points[points_last] - temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : (i1 + 1); // i2 is the second point of the line segment
                const unsigned int idx2 = (i1 + 1) == points_count ? _VtxCurrentIdx : (idx1 + 4); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2 * 4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1 + 2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1 + 0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[13] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[14] = (ImDrawIdx)(idx1 + 3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1 + 3); _IdxWritePtr[16] = (ImDrawIdx)(idx2 + 3); _IdxWritePtr[17] = (ImDrawIdx)(idx2 + 2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i * 4 + 0]; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i * 4 + 1]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i * 4 + 2]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i * 4 + 3]; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // [PATH 4] Non texture-based, Non anti-aliased lines
        const int idx_count = count * 6;
        const int vtx_count = count * 4;    // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + 2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + 2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + 3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}